

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall embree::SceneGraph::Node::~Node(Node *this)

{
  code *pcVar1;
  Node *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~Node() {
        if (opaque_geometry_destruction)
          opaque_geometry_destruction(geometry);
      }